

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltexture.cpp
# Opt level: O2

void __thiscall QOpenGLTexturePrivate::setWrapMode(QOpenGLTexturePrivate *this,WrapMode mode)

{
  BindingTarget bindingTarget;
  Target target;
  GLuint texture;
  QOpenGLTextureHelper *this_00;
  GLenum pname;
  
  target = this->target;
  if (target == Target1D) goto LAB_00151d6c;
  if (target != Target2D) {
    if (target == Target3D) {
      this->wrapModes[2] = mode;
      this->wrapModes[1] = mode;
      this->wrapModes[0] = mode;
      QOpenGLTextureHelper::glTextureParameteri
                (this->texFuncs,this->textureId,0x806f,this->bindingTarget,0x2802,mode);
      QOpenGLTextureHelper::glTextureParameteri
                (this->texFuncs,this->textureId,this->target,this->bindingTarget,0x2803,mode);
      this_00 = this->texFuncs;
      texture = this->textureId;
      target = this->target;
      bindingTarget = this->bindingTarget;
      pname = 0x8072;
      goto LAB_00151dc5;
    }
    if ((target != TargetRectangle) && (target != TargetCubeMap)) {
      if (target != Target1DArray) {
        if ((((target == Target2DArray) || (target == Target2DMultisampleArray)) ||
            (target == TargetCubeMapArray)) || (target == Target2DMultisample)) goto LAB_00151d87;
        if (target != TargetBuffer) {
          return;
        }
      }
LAB_00151d6c:
      this->wrapModes[0] = mode;
      this_00 = this->texFuncs;
      bindingTarget = this->bindingTarget;
      texture = this->textureId;
      pname = 0x2802;
      goto LAB_00151dc5;
    }
  }
LAB_00151d87:
  this->wrapModes[1] = mode;
  this->wrapModes[0] = mode;
  QOpenGLTextureHelper::glTextureParameteri
            (this->texFuncs,this->textureId,target,this->bindingTarget,0x2802,mode);
  this_00 = this->texFuncs;
  texture = this->textureId;
  target = this->target;
  bindingTarget = this->bindingTarget;
  pname = 0x2803;
LAB_00151dc5:
  QOpenGLTextureHelper::glTextureParameteri(this_00,texture,target,bindingTarget,pname,mode);
  return;
}

Assistant:

void QOpenGLTexturePrivate::setWrapMode(QOpenGLTexture::WrapMode mode)
{
    switch (target) {
    case QOpenGLTexture::Target1D:
    case QOpenGLTexture::Target1DArray:
    case QOpenGLTexture::TargetBuffer:
        wrapModes[0] = mode;
        texFuncs->glTextureParameteri(textureId, target, bindingTarget, GL_TEXTURE_WRAP_S, mode);
        break;

    case QOpenGLTexture::Target2D:
    case QOpenGLTexture::Target2DArray:
    case QOpenGLTexture::TargetCubeMap:
    case QOpenGLTexture::TargetCubeMapArray:
    case QOpenGLTexture::Target2DMultisample:
    case QOpenGLTexture::Target2DMultisampleArray:
    case QOpenGLTexture::TargetRectangle:
        wrapModes[0] = wrapModes[1] = mode;
        texFuncs->glTextureParameteri(textureId, target, bindingTarget, GL_TEXTURE_WRAP_S, mode);
        texFuncs->glTextureParameteri(textureId, target, bindingTarget, GL_TEXTURE_WRAP_T, mode);
        break;

    case QOpenGLTexture::Target3D:
        wrapModes[0] = wrapModes[1] = wrapModes[2] = mode;
        texFuncs->glTextureParameteri(textureId, target, bindingTarget, GL_TEXTURE_WRAP_S, mode);
        texFuncs->glTextureParameteri(textureId, target, bindingTarget, GL_TEXTURE_WRAP_T, mode);
        texFuncs->glTextureParameteri(textureId, target, bindingTarget, GL_TEXTURE_WRAP_R, mode);
        break;
    }
}